

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitFunctionCall(RegSlot resultReg,RegSlot funcReg,RegSlot thisReg,RegSlot argReg,
                     ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  bool bVar1;
  ArgSlot ArgCount;
  uint argCount;
  uint16 callSiteId;
  
  argCount = (argReg != 0xffffffff) + 1;
  FuncInfo::StartRecordingOutArgs(funcInfo,argCount);
  this = &byteCodeGenerator->m_writer;
  bVar1 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(this,CallI);
  callSiteId = byteCodeGenerator->m_callSiteId;
  if (bVar1) {
    if (callSiteId == 0xffff) {
      callSiteId = 0xffff;
    }
    else {
      byteCodeGenerator->m_callSiteId = callSiteId + 1;
    }
  }
  ArgCount = (ArgSlot)argCount;
  Js::ByteCodeWriter::StartCall(this,StartCall,ArgCount);
  Js::ByteCodeWriter::ArgOut<true>(this,0,thisReg,callSiteId,false);
  if (argReg != 0xffffffff) {
    Js::ByteCodeWriter::ArgOut<true>(this,1,argReg,callSiteId,false);
  }
  Js::ByteCodeWriter::CallI(this,CallI,resultReg,funcReg,ArgCount,callSiteId,CallFlags_None);
  return;
}

Assistant:

void EmitFunctionCall(
    Js::RegSlot resultReg,
    Js::RegSlot funcReg,
    Js::RegSlot thisReg,
    Js::RegSlot argReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Js::ArgSlot argCount = argReg == Js::Constants::NoRegister ? 1 : 2;
    funcInfo->StartRecordingOutArgs(argCount);
    Js::ProfileId callSite = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);
    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);

    byteCodeGenerator->Writer()->ArgOut<true>(0, thisReg, callSite, false);

    if (argReg != Js::Constants::NoRegister)
        byteCodeGenerator->Writer()->ArgOut<true>(1, argReg, callSite, false);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, resultReg, funcReg, argCount, callSite);
}